

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32_t tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  uint8_t uVar1;
  ushort uVar2;
  byte *pbVar3;
  char *pcVar4;
  uint8_t *puVar5;
  double *pdVar6;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  undefined1 uVar10;
  bool bVar11;
  CppStringType CVar12;
  uint32_t uVar14;
  UnknownFieldSet *pUVar15;
  Message *pMVar16;
  Nonnull<const_char_*> pcVar17;
  int64_t iVar18;
  int iVar13;
  EnumDescriptor *this;
  EnumValueDescriptor *value_00;
  undefined8 extraout_RAX;
  byte bVar19;
  uint64_t uVar20;
  ulong uVar21;
  unsigned_long uVar22;
  Reflection *this_00;
  undefined7 uVar23;
  Reflection *value_01;
  undefined7 extraout_var;
  int value_1;
  uint uVar24;
  ulong unaff_RBP;
  _Alloc_hider _Var25;
  CodedInputStream *pCVar26;
  char *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  CodedInputStream *pCVar28;
  Metadata MVar29;
  pair<unsigned_long,_bool> pVar30;
  pair<unsigned_long,_bool> pVar31;
  pair<unsigned_long,_bool> pVar32;
  pair<unsigned_long,_bool> pVar33;
  string_view field_name;
  string_view field_name_00;
  uint64_t value;
  anon_union_16_2_39e9c77e_for_Rep_0 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Reflection *local_c8;
  Limit local_bc;
  uint64_t local_b8;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  MVar29 = Message::GetMetadata(message);
  this_00 = MVar29.reflection;
  if (field == (FieldDescriptor *)0x0) {
    bVar19 = 1;
LAB_00319a95:
    bVar8 = 0;
    value_01 = this_00;
  }
  else {
    uVar24 = tag & 7;
    unaff_RBP = (ulong)uVar24;
    if (uVar24 == *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)field->type_ * 4)) {
      bVar19 = 0;
      goto LAB_00319a95;
    }
    bVar19 = field->field_0x1;
    uVar23 = MVar29.reflection._1_7_;
    bVar9 = (bool)((bVar19 & 0x20) >> 5);
    if (0xbf < bVar19 == bVar9) {
      pcVar17 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar9,0xbf < bVar19,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      uVar23 = extraout_var;
    }
    if (pcVar17 != (Nonnull<const_char_*>)0x0) {
      ParseAndMergeField();
      if ((CodedInputStream *)local_b0._0_8_ != input) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      if ((void *)local_e8.as_tree.cordz_info != (void *)(ulong)tag) {
        operator_delete((void *)local_e8.as_tree.cordz_info,
                        CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1)
        ;
      }
      _Unwind_Resume(extraout_RAX);
    }
    bVar9 = field->type_ - 0xd < 0xfffffffc;
    value_01 = (Reflection *)CONCAT71(uVar23,bVar9);
    bVar8 = uVar24 == 2 & (byte)field->field_0x1 >> 5 & bVar9;
    bVar19 = bVar8 ^ 1;
  }
  if (bVar19 != 0) {
    pUVar15 = Reflection::MutableUnknownFields(this_00,message);
    bVar9 = SkipField(input,tag,pUVar15);
    return bVar9;
  }
  if (bVar8 != 0) {
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      uVar24 = (uint)*pbVar3;
      if (-1 < (char)*pbVar3) {
        input->buffer_ = pbVar3 + 1;
        bVar9 = true;
        goto LAB_0031a20e;
      }
    }
    else {
      uVar24 = 0;
    }
    iVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar24);
    uVar24 = (uint)iVar18;
    bVar9 = -1 < iVar18;
LAB_0031a20e:
    if (!bVar9) {
      return false;
    }
    local_bc = io::CodedInputStream::PushLimit(input,uVar24);
    switch(field->type_) {
    case '\x01':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        pdVar6 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar6 < 8) {
          bVar9 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_e8.data);
        }
        else {
          local_e8.as_tree.cordz_info = (cordz_info_t)*pdVar6;
          input->buffer_ = (uint8_t *)(pdVar6 + 1);
          bVar9 = true;
        }
        if (bVar9 == false) {
          return false;
        }
        Reflection::AddDouble(this_00,message,field,(double)local_e8.as_tree.cordz_info);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x02':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        puVar5 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
          bVar9 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_e8.data);
        }
        else {
          local_e8.as_tree.cordz_info._4_4_ =
               (undefined4)((ulong)local_e8.as_tree.cordz_info >> 0x20);
          local_e8.as_tree.cordz_info._0_4_ = *(undefined4 *)puVar5;
          input->buffer_ = puVar5 + 4;
          bVar9 = true;
        }
        if (bVar9 == false) {
          return false;
        }
        Reflection::AddFloat(this_00,message,field,(float)local_e8.as_tree.cordz_info._0_4_);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x03':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar22 = (unsigned_long)(char)*puVar5, -1 < (long)uVar22)) {
          input->buffer_ = puVar5 + 1;
          pVar33._8_8_ = 1;
          pVar33.first = (unsigned_long)(puVar5 + 1);
        }
        else {
          pVar33 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar22 = pVar33.first;
        }
        if (((undefined1  [16])pVar33 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddInt64(this_00,message,field,uVar22);
      }
      break;
    case '\x04':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar20 = (uint64_t)(char)*puVar5, -1 < (long)uVar20))
        {
          input->buffer_ = puVar5 + 1;
          pVar31._8_8_ = 1;
          pVar31.first = (unsigned_long)(puVar5 + 1);
        }
        else {
          pVar31 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar20 = pVar31.first;
        }
        if (((undefined1  [16])pVar31 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddUInt64(this_00,message,field,uVar20);
      }
      break;
    case '\x05':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar19 = *pbVar3;
          uVar21 = (ulong)bVar19;
          uVar14 = (uint32_t)bVar19;
          if ((char)bVar19 < '\0') goto LAB_0031a478;
          input->buffer_ = pbVar3 + 1;
          bVar9 = true;
        }
        else {
          uVar14 = 0;
LAB_0031a478:
          uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar14);
          bVar9 = -1 < (long)uVar21;
        }
        if (!bVar9) {
          return false;
        }
        Reflection::AddInt32(this_00,message,field,(int32_t)uVar21);
      }
      break;
    case '\x06':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        pdVar6 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar6 < 8) {
          bVar9 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_e8.data);
          if (!bVar9) {
            return false;
          }
        }
        else {
          local_e8.as_tree.cordz_info = (cordz_info_t)*pdVar6;
          input->buffer_ = (uint8_t *)(pdVar6 + 1);
        }
        Reflection::AddUInt64(this_00,message,field,local_e8.as_tree.cordz_info);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\a':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        puVar5 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
          bVar9 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_e8.data);
          if (!bVar9) {
            return false;
          }
        }
        else {
          local_e8.as_tree.cordz_info._4_4_ =
               (undefined4)((ulong)local_e8.as_tree.cordz_info >> 0x20);
          local_e8.as_tree.cordz_info._0_4_ = *(undefined4 *)puVar5;
          input->buffer_ = puVar5 + 4;
        }
        Reflection::AddUInt32(this_00,message,field,local_e8.as_tree.cordz_info._0_4_);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\b':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar1 = *puVar5, -1 < (long)(char)uVar1)) {
          input->buffer_ = puVar5 + 1;
          pVar30._8_8_ = 1;
          pVar30.first = (long)(char)uVar1;
        }
        else {
          pVar30 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar30 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddBool(this_00,message,field,pVar30.first != 0);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      return false;
    case '\r':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar19 = *pbVar3;
          uVar21 = (ulong)bVar19;
          uVar14 = (uint32_t)bVar19;
          if ((char)bVar19 < '\0') goto LAB_0031a31a;
          input->buffer_ = pbVar3 + 1;
          bVar9 = true;
        }
        else {
          uVar14 = 0;
LAB_0031a31a:
          uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar14);
          bVar9 = -1 < (long)uVar21;
        }
        if (!bVar9) {
          return false;
        }
        Reflection::AddUInt32(this_00,message,field,(uint32_t)uVar21);
      }
      break;
    case '\x0e':
      local_c8 = this_00;
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar19 = *pbVar3;
          uVar21 = (ulong)bVar19;
          uVar14 = (uint32_t)bVar19;
          if ((char)bVar19 < '\0') goto LAB_0031a701;
          input->buffer_ = pbVar3 + 1;
          bVar9 = true;
        }
        else {
          uVar14 = 0;
LAB_0031a701:
          uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar14);
          bVar9 = -1 < (long)uVar21;
        }
        uVar7 = unaff_RBP;
        if (bVar9) {
          uVar7 = uVar21;
        }
        unaff_RBP = uVar7 & 0xffffffff;
        if (!bVar9) {
          return false;
        }
        bVar11 = FieldDescriptor::legacy_enum_field_treated_as_closed(field);
        iVar13 = (int)uVar7;
        if (bVar11) {
          this = FieldDescriptor::enum_type(field);
          value_00 = EnumDescriptor::FindValueByNumber(this,iVar13);
          if (value_00 == (EnumValueDescriptor *)0x0) {
            local_b8 = (uint64_t)iVar13;
            pUVar15 = Reflection::MutableUnknownFields(local_c8,message);
            UnknownFieldSet::AddVarint(pUVar15,tag >> 3,local_b8);
          }
          else {
            Reflection::AddEnum(local_c8,message,field,value_00);
          }
        }
        else {
          Reflection::AddEnumValue(local_c8,message,field,iVar13);
        }
        if (!bVar9) {
          return false;
        }
      }
      break;
    case '\x0f':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        puVar5 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
          bVar9 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_e8.data);
        }
        else {
          local_e8.as_tree.cordz_info._4_4_ =
               (undefined4)((ulong)local_e8.as_tree.cordz_info >> 0x20);
          local_e8.as_tree.cordz_info._0_4_ = *(undefined4 *)puVar5;
          input->buffer_ = puVar5 + 4;
          bVar9 = true;
        }
        if (bVar9 == false) {
          return false;
        }
        Reflection::AddInt32(this_00,message,field,local_e8.as_tree.cordz_info._0_4_);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x10':
      iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar13) {
        pdVar6 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar6 < 8) {
          bVar9 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_e8.data);
        }
        else {
          local_e8.as_tree.cordz_info = (cordz_info_t)*pdVar6;
          input->buffer_ = (uint8_t *)(pdVar6 + 1);
          bVar9 = true;
        }
        if (bVar9 == false) {
          return false;
        }
        Reflection::AddInt64(this_00,message,field,local_e8.as_tree.cordz_info);
        iVar13 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x11':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar19 = *pbVar3;
          uVar21 = (ulong)bVar19;
          uVar14 = (uint32_t)bVar19;
          if ((char)bVar19 < '\0') goto LAB_0031a263;
          input->buffer_ = pbVar3 + 1;
          bVar9 = true;
        }
        else {
          uVar14 = 0;
LAB_0031a263:
          uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar14);
          bVar9 = -1 < (long)uVar21;
        }
        if (!bVar9) {
          return false;
        }
        Reflection::AddInt32
                  (this_00,message,field,-((uint)uVar21 & 1) ^ (uint)(uVar21 >> 1) & 0x7fffffff);
      }
      break;
    case '\x12':
      while (iVar13 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar13) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar21 = (ulong)(char)*puVar5, -1 < (long)uVar21)) {
          input->buffer_ = puVar5 + 1;
          pVar32._8_8_ = 1;
          pVar32.first = (unsigned_long)(puVar5 + 1);
        }
        else {
          pVar32 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar21 = pVar32.first;
        }
        if (((undefined1  [16])pVar32 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        Reflection::AddInt64(this_00,message,field,-(ulong)((uint)uVar21 & 1) ^ uVar21 >> 1);
      }
    }
    io::CodedInputStream::PopLimit(input,local_bc);
    return true;
  }
  switch(field->type_) {
  case '\x01':
    uVar10 = WireFormatLite::
             ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                       (input,(double *)&local_e8);
    if (!(bool)uVar10) {
      return false;
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddDouble(this_00,message,field,(double)local_e8.as_tree.cordz_info);
    }
    else {
      Reflection::SetDouble(this_00,message,field,(double)local_e8.as_tree.cordz_info);
    }
    break;
  case '\x02':
    uVar10 = WireFormatLite::
             ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                       (input,(float *)&local_e8);
    if (!(bool)uVar10) {
      return false;
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddFloat(this_00,message,field,(float)local_e8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetFloat(this_00,message,field,(float)local_e8.as_tree.cordz_info._0_4_);
    }
    break;
  case '\x03':
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (uVar22 = (unsigned_long)(char)*puVar5, -1 < (long)uVar22))
    {
      input->buffer_ = puVar5 + 1;
      uVar24 = 1;
    }
    else {
      pVar32 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar22 = pVar32.first;
      uVar24 = pVar32._8_4_;
    }
    if ((uVar24 & 1) == 0) {
      return false;
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddInt64(this_00,message,field,uVar22);
    }
    else {
      Reflection::SetInt64(this_00,message,field,uVar22);
    }
    goto LAB_0031a064;
  case '\x04':
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (uVar20 = (uint64_t)(char)*puVar5, -1 < (long)uVar20)) {
      input->buffer_ = puVar5 + 1;
      uVar24 = 1;
    }
    else {
      pVar32 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar20 = pVar32.first;
      uVar24 = pVar32._8_4_;
    }
    if ((uVar24 & 1) == 0) {
      return false;
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddUInt64(this_00,message,field,uVar20);
    }
    else {
      Reflection::SetUInt64(this_00,message,field,uVar20);
    }
LAB_0031a064:
    if ((uVar24 & 1) == 0) {
      return false;
    }
    return true;
  case '\x05':
    uVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                       (input,(int32_t *)local_e8.data);
    goto LAB_00319c04;
  case '\x06':
    pdVar6 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar6 < 8) {
      uVar10 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)local_e8.data);
    }
    else {
      local_e8.as_tree.cordz_info = (cordz_info_t)*pdVar6;
      input->buffer_ = (uint8_t *)(pdVar6 + 1);
      uVar10 = true;
    }
    if ((bool)uVar10 == false) {
      return false;
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddUInt64(this_00,message,field,local_e8.as_tree.cordz_info);
    }
    else {
      Reflection::SetUInt64(this_00,message,field,local_e8.as_tree.cordz_info);
    }
    break;
  case '\a':
    puVar5 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
      uVar10 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)local_e8.data);
    }
    else {
      local_e8.as_tree.cordz_info._0_4_ = *(undefined4 *)puVar5;
      input->buffer_ = puVar5 + 4;
      uVar10 = true;
    }
    if ((bool)uVar10 == false) {
      return false;
    }
    goto LAB_00319e51;
  case '\b':
    uVar10 = WireFormatLite::
             ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                       ((WireFormatLite *)input,(CodedInputStream *)&local_e8.as_tree,
                        (bool *)value_01);
    if (!(bool)uVar10) {
      return false;
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddBool(this_00,message,field,(bool)local_e8.data[0]);
    }
    else {
      Reflection::SetBool(this_00,message,field,(bool)local_e8.data[0]);
    }
    break;
  case '\t':
    bVar9 = FieldDescriptor::requires_utf8_validation(field);
    local_e8.as_tree.rep = (CordRep *)0x0;
    local_d8._M_local_buf[0] = '\0';
    local_e8.as_tree.cordz_info = (cordz_info_t)&local_d8;
    bVar11 = WireFormatLite::ReadBytes(input,(string *)&local_e8.as_tree);
    if (!bVar11) {
LAB_00319f83:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.as_tree.cordz_info == &local_d8) {
        return false;
      }
      operator_delete((void *)local_e8.as_tree.cordz_info,
                      CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
      return false;
    }
    pcVar4 = (field->all_names_).payload_;
    uVar2 = *(ushort *)(pcVar4 + 2);
    field_name._M_len = pcVar4 + ~(ulong)uVar2;
    if (bVar9) {
      field_name._M_str = in_R9;
      bVar9 = WireFormatLite::VerifyUtf8String
                        ((WireFormatLite *)local_e8.as_tree.cordz_info,
                         (char *)((ulong)local_e8.as_tree.rep & 0xffffffff),0,(uint)uVar2,field_name
                        );
      if (!bVar9) goto LAB_00319f83;
    }
    else {
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)field_name._M_len;
      WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)local_e8.as_tree.cordz_info,
                 (char *)((ulong)local_e8.as_tree.rep & 0xffffffff),0,(uint)uVar2,field_name_00);
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      paVar27 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar27;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_e8.as_tree.cordz_info,
                 (local_e8.as_tree.rep)->storage + local_e8.as_tree.cordz_info + -0xd);
      Reflection::AddString(this_00,message,field,&local_50);
      _Var25._M_p = local_50._M_dataplus._M_p;
    }
    else {
      paVar27 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar27;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_e8.as_tree.cordz_info,
                 (local_e8.as_tree.rep)->storage + local_e8.as_tree.cordz_info + -0xd);
      Reflection::SetString(this_00,message,field,&local_70);
      _Var25._M_p = local_70._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var25._M_p != paVar27) {
      operator_delete(_Var25._M_p,paVar27->_M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.as_tree.cordz_info == &local_d8) {
      return true;
    }
    operator_delete((void *)local_e8.as_tree.cordz_info,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
    return true;
  case '\n':
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      pMVar16 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar16 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    uVar10 = WireFormatLite::ReadGroup<google::protobuf::Message>(tag >> 3,input,pMVar16);
    break;
  case '\v':
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      pMVar16 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar16 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    uVar10 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,pMVar16);
    break;
  case '\f':
    CVar12 = FieldDescriptor::cpp_string_type(field);
    if (CVar12 == kCord) {
      local_e8.as_tree.cordz_info = 0;
      local_e8.as_tree.rep = (CordRep *)0x0;
      uVar10 = WireFormatLite::ReadBytes(input,(Cord *)&local_e8.as_tree);
      if (!(bool)uVar10) {
        absl::lts_20250127::Cord::~Cord((Cord *)&local_e8.as_tree);
        return false;
      }
      Reflection::SetString(this_00,message,field,(Cord *)&local_e8.as_tree);
      absl::lts_20250127::Cord::~Cord((Cord *)&local_e8.as_tree);
    }
    else {
      local_e8.as_tree.rep = (CordRep *)0x0;
      local_d8._M_local_buf[0] = '\0';
      local_e8.as_tree.cordz_info = (cordz_info_t)&local_d8;
      uVar10 = WireFormatLite::ReadBytes(input,(string *)&local_e8.as_tree);
      if (!(bool)uVar10) goto LAB_00319f83;
      bVar9 = FieldDescriptor::is_repeated(field);
      if (bVar9) {
        pCVar28 = (CodedInputStream *)(local_90 + 0x10);
        local_90._0_8_ = pCVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,local_e8.as_tree.cordz_info,
                   (local_e8.as_tree.rep)->storage + local_e8.as_tree.cordz_info + -0xd);
        Reflection::AddString(this_00,message,field,(string *)local_90);
        pCVar26 = (CodedInputStream *)local_90._0_8_;
      }
      else {
        pCVar28 = (CodedInputStream *)(local_b0 + 0x10);
        local_b0._0_8_ = pCVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,local_e8.as_tree.cordz_info,
                   (local_e8.as_tree.rep)->storage + local_e8.as_tree.cordz_info + -0xd);
        Reflection::SetString(this_00,message,field,(string *)local_b0);
        pCVar26 = (CodedInputStream *)local_b0._0_8_;
      }
      if (pCVar26 != pCVar28) {
        operator_delete(pCVar26,(ulong)(pCVar28->buffer_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.as_tree.cordz_info != &local_d8) {
        operator_delete((void *)local_e8.as_tree.cordz_info,
                        CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1)
        ;
      }
    }
    break;
  case '\r':
    uVar10 = WireFormatLite::
             ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                       (input,(uint32_t *)local_e8.data);
    if (!(bool)uVar10) {
      return false;
    }
LAB_00319e51:
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddUInt32(this_00,message,field,local_e8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetUInt32(this_00,message,field,local_e8.as_tree.cordz_info._0_4_);
    }
    break;
  case '\x0e':
    uVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                       (input,(int *)local_e8.data);
    if (!(bool)uVar10) {
      return false;
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddEnumValue(this_00,message,field,local_e8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetEnumValue(this_00,message,field,local_e8.as_tree.cordz_info._0_4_);
    }
    break;
  case '\x0f':
    uVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                       (input,(int32_t *)local_e8.data);
    goto LAB_00319c04;
  case '\x10':
    uVar10 = WireFormatLite::
             ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                       (input,(int64_t *)local_e8.data);
    goto LAB_00319d62;
  case '\x11':
    uVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                       (input,(int32_t *)local_e8.data);
LAB_00319c04:
    if ((bool)uVar10 == false) {
      return false;
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddInt32(this_00,message,field,local_e8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetInt32(this_00,message,field,local_e8.as_tree.cordz_info._0_4_);
    }
    break;
  case '\x12':
    uVar10 = WireFormatLite::
             ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                       ((WireFormatLite *)input,(CodedInputStream *)&local_e8.as_tree,
                        (int64_t *)value_01);
LAB_00319d62:
    if ((bool)uVar10 == false) {
      return false;
    }
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      Reflection::AddInt64(this_00,message,field,local_e8.as_tree.cordz_info);
    }
    else {
      Reflection::SetInt64(this_00,message,field,local_e8.as_tree.cordz_info);
    }
    break;
  default:
    goto LAB_0031a809;
  }
  if ((bool)uVar10 == false) {
    return false;
  }
LAB_0031a809:
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32_t tag,
    const FieldDescriptor* field,  // May be nullptr for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == nullptr) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32_t length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (!field->legacy_enum_field_treated_as_closed()) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != nullptr) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64_t sign_extended_value = static_cast<int64_t>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32_t, Int32)
      HANDLE_TYPE(INT64, int64_t, Int64)
      HANDLE_TYPE(SINT32, int32_t, Int32)
      HANDLE_TYPE(SINT64, int64_t, Int64)
      HANDLE_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value;
          if (!WireFormatLite::ReadBytes(input, &value)) return false;
          message_reflection->SetString(message, field, value);
          break;
        }
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}